

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFallbackFunction<duckdb::ModeString>::
     Finalize<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *state,
               AggregateFinalizeData *finalize_data)

{
  const_iterator cVar1;
  OrderModifiers in_R9W;
  string_t sort_key;
  
  if (state->frequency_map != (Counts *)0x0) {
    cVar1 = ModeState<duckdb::string_t,_duckdb::ModeString>::Scan(state);
    if (cVar1.super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>.
        _M_cur != (__node_type *)0x0) {
      sort_key.value.pointer.ptr = (char *)finalize_data->result;
      sort_key.value._0_8_ =
           *(undefined8 *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                   ._M_cur + 0x10);
      CreateSortKeyHelpers::DecodeSortKey
                (*(CreateSortKeyHelpers **)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                         ._M_cur + 8),sort_key,(Vector *)finalize_data->result_idx,0x302,in_R9W);
      return;
    }
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, AggregateFinalizeData &finalize_data) {
		if (!state.frequency_map) {
			finalize_data.ReturnNull();
			return;
		}
		auto highest_frequency = state.Scan();
		if (highest_frequency != state.frequency_map->end()) {
			CreateSortKeyHelpers::DecodeSortKey(highest_frequency->first, finalize_data.result,
			                                    finalize_data.result_idx,
			                                    OrderModifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST));
		} else {
			finalize_data.ReturnNull();
		}
	}